

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rc_model_v2.c
# Opt level: O3

MPP_RET reenc_calc_cbr_ratio(void *ctx,EncRcTaskInfo *cfg)

{
  uint uVar1;
  uint uVar2;
  int iVar3;
  int iVar4;
  RK_S32 RVar5;
  int iVar6;
  RK_S32 RVar7;
  int iVar8;
  uint uVar9;
  int iVar10;
  uint uVar11;
  int iVar12;
  ulong uVar13;
  int iVar14;
  ulong uVar15;
  int iVar16;
  int iVar17;
  bool bVar18;
  float fVar19;
  double dVar20;
  
  iVar12 = *(int *)((long)ctx + 0x3c);
  RVar5 = mpp_data_sum_v2(*(MppDataV2 **)((long)ctx + 0x208));
  iVar6 = (int)((long)RVar5 / (long)iVar12);
  RVar7 = mpp_data_get_pre_val_v2(*(MppDataV2 **)((long)ctx + 0x208),-1);
  uVar1 = cfg->bit_target;
  uVar2 = cfg->bit_real;
  uVar13 = (long)(int)((iVar6 * iVar12 - RVar7) + uVar2) / (long)iVar12;
  iVar10 = *(int *)((long)ctx + 0x1b8);
  iVar3 = *ctx;
  iVar4 = *(int *)((long)ctx + 4);
  uVar11 = uVar2;
  if ((rc_debug & 1) != 0) {
    _mpp_log_l(4,"rc_model_v2","enter %p\n","reenc_calc_cbr_ratio");
    uVar11 = cfg->bit_real;
  }
  if (((int)uVar11 < *(int *)((long)ctx + 0x200)) || (*(int *)((long)ctx + 0xc4) != 1)) {
    iVar14 = *(int *)((long)ctx + 0x224) + uVar2;
    if (*(int *)((long)ctx + 0x220) <= iVar14) {
      iVar14 = *(int *)((long)ctx + 0x220);
    }
    iVar14 = iVar14 - *(int *)((long)ctx + 0x110);
    iVar17 = 0;
    if (iVar14 < 1) {
      iVar14 = iVar17;
    }
    uVar11 = uVar2;
    if ((int)uVar1 < (int)uVar2) {
      uVar11 = uVar1;
    }
    iVar8 = (int)((uVar1 - uVar2) * -0x20) / (int)uVar11;
    iVar16 = (int)uVar13;
    uVar11 = (uint)((long)((ulong)(uint)(iVar16 >> 0x1f) << 0x20 | uVar13 & 0xffffffff) /
                   (long)(iVar10 >> 5));
    if (0x3e < (int)uVar11) {
      uVar11 = 0x3f;
    }
    uVar13 = (ulong)uVar11;
    if ((int)uVar11 < 1) {
      uVar13 = 0;
    }
    uVar9 = (uint)((long)((ulong)(uint)(iVar6 >> 0x1f) << 0x20 |
                         (long)RVar5 / (long)iVar12 & 0xffffffffU) / (long)(iVar10 >> 5));
    uVar11 = 0x3f;
    if ((int)uVar9 < 0x3f) {
      uVar11 = uVar9;
    }
    uVar15 = (ulong)uVar11;
    if ((int)uVar11 < 1) {
      uVar15 = 0;
    }
    iVar12 = ((iVar16 - iVar10) * 0x60) / iVar10;
    iVar14 = ((iVar14 - *(int *)((long)ctx + 0x228)) * 0x20) / *(int *)((long)ctx + 0x228);
    if (iVar10 == iVar6 || iVar16 <= iVar6) {
      bVar18 = false;
      if (cfg->frame_type == INTRA_FRAME) {
        iVar10 = (tab_lnx[uVar13] - tab_lnx[uVar15]) * 3;
        iVar6 = 0x100;
        if (iVar10 < 0x100) {
          iVar6 = iVar10;
        }
        iVar17 = -0xc0;
        if (-0xc0 < iVar6) {
          iVar17 = iVar6;
        }
        bVar18 = true;
      }
    }
    else {
      iVar10 = (tab_lnx[uVar13] - tab_lnx[uVar15]) * 6;
      iVar6 = 0x100;
      if (iVar10 < 0x100) {
        iVar6 = iVar10;
      }
      iVar17 = -0xc0;
      if (-0xc0 < iVar6) {
        iVar17 = iVar6;
      }
      bVar18 = cfg->frame_type == INTRA_FRAME;
    }
    iVar10 = 0x100;
    if (iVar8 < 0x100) {
      iVar10 = iVar8;
    }
    iVar6 = -0x80;
    if (-0x80 < iVar10) {
      iVar6 = iVar10;
    }
    if (0x1f < iVar12) {
      iVar12 = 0x20;
    }
    if (iVar12 < -0x1f) {
      iVar12 = -0x20;
    }
    iVar10 = 0x20;
    if (iVar14 < 0x20) {
      iVar10 = iVar14;
    }
    if (iVar10 < -0x1f) {
      iVar10 = -0x20;
    }
    iVar17 = iVar10 + iVar6 + iVar12 + iVar17;
    *(int *)((long)ctx + 0x230) = iVar17;
    if ((bVar18) && (iVar12 = cfg->madi, 0 < iVar12)) {
      dVar20 = log((double)((long)(int)uVar1 / (long)((iVar4 + 0xf >> 4) * (iVar3 + 0xf >> 4)) &
                           0xffffffff));
      fVar19 = ((float)iVar12 * 0.0438 - (float)dVar20) * 6.9686413 + 60.832054;
      if ((float)(*(int *)((long)ctx + 0x24c) >> 6) < (float)(int)fVar19) {
        iVar17 = (int)fVar19 * 0x40 - *(int *)((long)ctx + 0x24c);
        *(int *)((long)ctx + 0x230) = iVar17;
      }
    }
    if ((rc_debug & 0x40) != 0) {
      _mpp_log_l(4,"rc_model_v2","cbr target_bit %d real_bit %d reenc next ratio %d",
                 "reenc_calc_cbr_ratio",(ulong)uVar1,(ulong)uVar2,iVar17);
    }
    if ((rc_debug & 1) != 0) {
      _mpp_log_l(4,"rc_model_v2","leave %p\n","reenc_calc_cbr_ratio",ctx);
    }
  }
  else {
    reenc_calc_super_frm_ratio(ctx,cfg);
  }
  return MPP_OK;
}

Assistant:

MPP_RET reenc_calc_cbr_ratio(void *ctx, EncRcTaskInfo *cfg)
{
    RcModelV2Ctx *p = (RcModelV2Ctx *)ctx;
    RcCfg *usr_cfg = &p->usr_cfg;
    RK_S32 stat_time = usr_cfg->stats_time;
    RK_S32 pre_ins_bps = mpp_data_sum_v2(p->stat_bits) / stat_time;
    RK_S32 ins_bps = (pre_ins_bps * stat_time - mpp_data_get_pre_val_v2(p->stat_bits, -1) + cfg->bit_real) / stat_time;
    RK_S32 real_bit = cfg->bit_real;
    RK_S32 target_bit = cfg->bit_target;
    RK_S32 target_bps = p->target_bps;
    RK_S32 water_level = 0;
    RK_S32 idx1, idx2;
    RK_S32 bit_diff_ratio, ins_ratio, bps_ratio, wl_ratio;
    RK_S32 mb_w = MPP_ALIGN(usr_cfg->width, 16) / 16;
    RK_S32 mb_h = MPP_ALIGN(usr_cfg->height, 16) / 16;

    rc_dbg_func("enter %p\n", p);

    if (p->cur_super_thd <= cfg->bit_real &&
        usr_cfg->super_cfg.rc_priority == MPP_ENC_RC_BY_FRM_SIZE_FIRST) {
        return reenc_calc_super_frm_ratio(ctx, cfg);
    }

    if (real_bit + p->stat_watl > p->watl_thrd)
        water_level = p->watl_thrd - p->bit_per_frame;
    else
        water_level = real_bit + p->stat_watl - p->bit_per_frame;

    if (water_level < 0) {
        water_level = 0;
    }

    if (target_bit > real_bit)
        bit_diff_ratio = 32 * (real_bit - target_bit) / real_bit;
    else
        bit_diff_ratio = 32 * (real_bit - target_bit) / target_bit;

    idx1 = ins_bps / (target_bps >> 5);
    idx2 = pre_ins_bps / (target_bps >> 5);

    idx1 = mpp_clip(idx1, 0, 63);
    idx2 = mpp_clip(idx2, 0, 63);
    ins_ratio = tab_lnx[idx1] - tab_lnx[idx2];

    bps_ratio = 96 * (ins_bps - target_bps) / target_bps;
    wl_ratio = 32 * (water_level - p->watl_base) /  p->watl_base;
    if (pre_ins_bps < ins_bps && target_bps != pre_ins_bps) {
        ins_ratio = 6 * ins_ratio;
        ins_ratio = mpp_clip(ins_ratio, -192, 256);
    } else {
        if (cfg->frame_type == INTRA_FRAME) {
            ins_ratio = 3 * ins_ratio;
            ins_ratio = mpp_clip(ins_ratio, -192, 256);
        } else {
            ins_ratio = 0;
        }
    }

    bit_diff_ratio = mpp_clip(bit_diff_ratio, -128, 256);
    bps_ratio = mpp_clip(bps_ratio, -32, 32);
    wl_ratio  = mpp_clip(wl_ratio, -32, 32);
    p->next_ratio = bit_diff_ratio + ins_ratio + bps_ratio + wl_ratio;
    if (cfg->frame_type  == INTRA_FRAME && (cfg->madi > 0)) {
        RK_U32 tar_bpp = target_bit / (mb_w * mb_h);
        float lnb_t = log(tar_bpp);
        float c = 6.7204, a = -0.1435, b = 0.0438;
        float start_qp = (p->cur_scale_qp >> 6);
        int qp_c = ((lnb_t - cfg->madi * b - c) / a + 14);
        if (qp_c > start_qp)
            p->next_ratio  = (qp_c << 6) - p->cur_scale_qp;
    }
    rc_dbg_rc("cbr target_bit %d real_bit %d reenc next ratio %d", target_bit, real_bit, p->next_ratio);
    rc_dbg_func("leave %p\n", p);
    return MPP_OK;
}